

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueKmerIndex.cc
# Opt level: O0

void __thiscall
Unique63merIndex::Unique63merIndex(Unique63merIndex *this,SequenceDistanceGraph *sg,uint8_t _k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  size_type sVar12;
  ulong uVar13;
  long lVar14;
  value_type vVar15;
  reference pvVar16;
  const_reference pvVar17;
  pointer ppVar18;
  difference_type dVar19;
  reference __p;
  reference this_00;
  mapped_type *pmVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 in_DL;
  long in_RSI;
  long in_RDI;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  byte bVar36;
  pair<std::__detail::_Node_iterator<long,_true,_false>,_bool> pVar37;
  pair<unsigned___int128,_graphStrandPos> *kidx;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  *__range1;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen_contigs;
  iterator nri;
  iterator ri;
  iterator wi;
  sgNodeID_t n_1;
  kmerPosFactory128 kcf;
  FastaRecord r;
  size_type n;
  value_type sgnode;
  sgNodeID_t node;
  uint64_t total_k;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  kidxv;
  undefined7 in_stack_fffffffffffffa98;
  uint8_t in_stack_fffffffffffffa9f;
  _Node_iterator_base<long,_false> in_stack_fffffffffffffaa0;
  allocator_type *in_stack_fffffffffffffaa8;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *in_stack_fffffffffffffab0;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  *in_stack_fffffffffffffab8;
  kmerPosFactory128 *in_stack_fffffffffffffac0;
  size_type in_stack_fffffffffffffac8;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  *in_stack_fffffffffffffad0;
  char local_508;
  char cStack_507;
  char cStack_506;
  char cStack_505;
  char cStack_504;
  char cStack_503;
  char cStack_502;
  char cStack_501;
  char cStack_500;
  char cStack_4ff;
  char cStack_4fe;
  char cStack_4fd;
  char cStack_4fc;
  char cStack_4fb;
  char cStack_4fa;
  char cStack_4f9;
  graphStrandPos local_488;
  reference local_478;
  pair<unsigned___int128,_graphStrandPos> *local_470;
  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
  local_468;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  *local_460;
  undefined8 local_450;
  pair<unsigned___int128,_graphStrandPos> *local_3f8;
  pair<unsigned___int128,_graphStrandPos> *local_3f0;
  pair<unsigned___int128,_graphStrandPos> *local_3e8;
  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
  local_3e0;
  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
  local_3d8;
  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
  local_3d0 [2];
  pair<unsigned___int128,_graphStrandPos> *local_3c0;
  pair<unsigned___int128,_graphStrandPos> *local_3b8;
  ulong local_3b0;
  undefined4 local_100;
  string local_d8 [32];
  value_type local_b8;
  ulong local_78;
  undefined8 local_58;
  long local_38;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  local_30;
  undefined1 local_11;
  long local_10;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  std::
  unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
  ::unordered_map((unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
                   *)0x4668e0);
  *(undefined1 *)(in_RDI + 0x38) = local_11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x466903);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x46691c);
  std::
  unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
  ::clear((unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
           *)0x466929);
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::vector((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            *)0x466936);
  local_38 = 0;
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40));
  local_58 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x46697c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffac0,
             (size_type)in_stack_fffffffffffffab8,(value_type_conflict1 *)in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffab0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffaa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffab0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x4669d6);
  for (local_78 = 0; uVar13 = local_78,
      sVar12 = std::vector<Node,_std::allocator<Node>_>::size
                         ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40)), uVar13 < sVar12
      ; local_78 = local_78 + 1) {
    std::vector<Node,_std::allocator<Node>_>::operator[]
              ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40),local_78);
    Node::Node((Node *)in_stack_fffffffffffffaa0._M_cur,
               (Node *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    uVar13 = std::__cxx11::string::size();
    if (*(byte *)(in_RDI + 0x38) <= uVar13) {
      lVar14 = std::__cxx11::string::size();
      vVar15 = (lVar14 + 1) - (ulong)*(byte *)(in_RDI + 0x38);
      local_38 = vVar15 + local_38;
      local_b8 = vVar15;
      pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x58),
                           local_78);
      *pvVar16 = vVar15;
    }
    Node::~Node((Node *)0x466b1e);
  }
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::reserve(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  FastaRecord::FastaRecord((FastaRecord *)in_stack_fffffffffffffaa0._M_cur);
  kmerPosFactory128::kmerPosFactory128
            ((kmerPosFactory128 *)in_stack_fffffffffffffaa0._M_cur,in_stack_fffffffffffffa9f);
  for (local_3b0 = 1; uVar13 = local_3b0,
      sVar12 = std::vector<Node,_std::allocator<Node>_>::size
                         ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40)), uVar13 < sVar12
      ; local_3b0 = local_3b0 + 1) {
    std::vector<Node,_std::allocator<Node>_>::operator[]
              ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40),local_3b0);
    uVar13 = std::__cxx11::string::size();
    if (*(byte *)(in_RDI + 0x38) <= uVar13) {
      local_100 = (undefined4)local_3b0;
      pvVar17 = std::vector<Node,_std::allocator<Node>_>::operator[]
                          ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40),local_3b0);
      std::__cxx11::string::operator=(local_d8,(string *)pvVar17);
      kmerPosFactory128::setFileRecord
                ((kmerPosFactory128 *)in_stack_fffffffffffffaa0._M_cur,
                 (FastaRecord *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      kmerPosFactory128::next_element(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    }
  }
  local_3b8 = (pair<unsigned___int128,_graphStrandPos> *)
              std::
              vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
              ::begin((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  local_3c0 = (pair<unsigned___int128,_graphStrandPos> *)
              std::
              vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
              ::end((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  sdglib::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>
            (local_3b8,local_3c0);
  local_3d0[0]._M_current =
       (pair<unsigned___int128,_graphStrandPos> *)
       std::
       vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
       ::begin((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  local_3d8._M_current =
       (pair<unsigned___int128,_graphStrandPos> *)
       std::
       vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
       ::begin((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  local_3e0._M_current =
       (pair<unsigned___int128,_graphStrandPos> *)
       std::
       vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
       ::begin((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  while( true ) {
    local_3e8 = (pair<unsigned___int128,_graphStrandPos> *)
                std::
                vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ::end((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    bVar9 = __gnu_cxx::operator<
                      ((__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                        *)in_stack_fffffffffffffaa0._M_cur,
                       (__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    if (!bVar9) break;
    while( true ) {
      local_3f0 = (pair<unsigned___int128,_graphStrandPos> *)
                  std::
                  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                  ::end((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                         *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      bVar10 = __gnu_cxx::operator!=
                         ((__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                           *)in_stack_fffffffffffffaa0._M_cur,
                          (__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
      bVar9 = false;
      if (bVar10) {
        ppVar18 = __gnu_cxx::
                  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                  ::operator->(&local_3e0);
        uVar7 = (undefined8)ppVar18->first;
        uVar8 = *(undefined8 *)((long)&ppVar18->first + 8);
        ppVar18 = __gnu_cxx::
                  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                  ::operator->(&local_3d8);
        local_508 = (char)uVar7;
        cStack_507 = (char)((ulong)uVar7 >> 8);
        cStack_506 = (char)((ulong)uVar7 >> 0x10);
        cStack_505 = (char)((ulong)uVar7 >> 0x18);
        cStack_504 = (char)((ulong)uVar7 >> 0x20);
        cStack_503 = (char)((ulong)uVar7 >> 0x28);
        cStack_502 = (char)((ulong)uVar7 >> 0x30);
        cStack_501 = (char)((ulong)uVar7 >> 0x38);
        cStack_500 = (char)uVar8;
        cStack_4ff = (char)((ulong)uVar8 >> 8);
        cStack_4fe = (char)((ulong)uVar8 >> 0x10);
        cStack_4fd = (char)((ulong)uVar8 >> 0x18);
        cStack_4fc = (char)((ulong)uVar8 >> 0x20);
        cStack_4fb = (char)((ulong)uVar8 >> 0x28);
        cStack_4fa = (char)((ulong)uVar8 >> 0x30);
        cStack_4f9 = (char)((ulong)uVar8 >> 0x38);
        cVar21 = -(local_508 == (char)ppVar18->first);
        cVar22 = -(cStack_507 == *(char *)((long)&ppVar18->first + 1));
        cVar23 = -(cStack_506 == *(char *)((long)&ppVar18->first + 2));
        cVar24 = -(cStack_505 == *(char *)((long)&ppVar18->first + 3));
        cVar25 = -(cStack_504 == *(char *)((long)&ppVar18->first + 4));
        cVar26 = -(cStack_503 == *(char *)((long)&ppVar18->first + 5));
        cVar27 = -(cStack_502 == *(char *)((long)&ppVar18->first + 6));
        cVar28 = -(cStack_501 == *(char *)((long)&ppVar18->first + 7));
        cVar29 = -(cStack_500 == *(char *)((long)&ppVar18->first + 8));
        cVar30 = -(cStack_4ff == *(char *)((long)&ppVar18->first + 9));
        cVar31 = -(cStack_4fe == *(char *)((long)&ppVar18->first + 10));
        cVar32 = -(cStack_4fd == *(char *)((long)&ppVar18->first + 0xb));
        cVar33 = -(cStack_4fc == *(char *)((long)&ppVar18->first + 0xc));
        cVar34 = -(cStack_4fb == *(char *)((long)&ppVar18->first + 0xd));
        cVar35 = -(cStack_4fa == *(char *)((long)&ppVar18->first + 0xe));
        bVar36 = -(cStack_4f9 == *(char *)((long)&ppVar18->first + 0xf));
        auVar1[1] = cVar22;
        auVar1[0] = cVar21;
        auVar1[2] = cVar23;
        auVar1[3] = cVar24;
        auVar1[4] = cVar25;
        auVar1[5] = cVar26;
        auVar1[6] = cVar27;
        auVar1[7] = cVar28;
        auVar1[8] = cVar29;
        auVar1[9] = cVar30;
        auVar1[10] = cVar31;
        auVar1[0xb] = cVar32;
        auVar1[0xc] = cVar33;
        auVar1[0xd] = cVar34;
        auVar1[0xe] = cVar35;
        auVar1[0xf] = bVar36;
        auVar2[1] = cVar22;
        auVar2[0] = cVar21;
        auVar2[2] = cVar23;
        auVar2[3] = cVar24;
        auVar2[4] = cVar25;
        auVar2[5] = cVar26;
        auVar2[6] = cVar27;
        auVar2[7] = cVar28;
        auVar2[8] = cVar29;
        auVar2[9] = cVar30;
        auVar2[10] = cVar31;
        auVar2[0xb] = cVar32;
        auVar2[0xc] = cVar33;
        auVar2[0xd] = cVar34;
        auVar2[0xe] = cVar35;
        auVar2[0xf] = bVar36;
        auVar6[1] = cVar24;
        auVar6[0] = cVar23;
        auVar6[2] = cVar25;
        auVar6[3] = cVar26;
        auVar6[4] = cVar27;
        auVar6[5] = cVar28;
        auVar6[6] = cVar29;
        auVar6[7] = cVar30;
        auVar6[8] = cVar31;
        auVar6[9] = cVar32;
        auVar6[10] = cVar33;
        auVar6[0xb] = cVar34;
        auVar6[0xc] = cVar35;
        auVar6[0xd] = bVar36;
        auVar5[1] = cVar25;
        auVar5[0] = cVar24;
        auVar5[2] = cVar26;
        auVar5[3] = cVar27;
        auVar5[4] = cVar28;
        auVar5[5] = cVar29;
        auVar5[6] = cVar30;
        auVar5[7] = cVar31;
        auVar5[8] = cVar32;
        auVar5[9] = cVar33;
        auVar5[10] = cVar34;
        auVar5[0xb] = cVar35;
        auVar5[0xc] = bVar36;
        auVar4[1] = cVar26;
        auVar4[0] = cVar25;
        auVar4[2] = cVar27;
        auVar4[3] = cVar28;
        auVar4[4] = cVar29;
        auVar4[5] = cVar30;
        auVar4[6] = cVar31;
        auVar4[7] = cVar32;
        auVar4[8] = cVar33;
        auVar4[9] = cVar34;
        auVar4[10] = cVar35;
        auVar4[0xb] = bVar36;
        auVar3[1] = cVar27;
        auVar3[0] = cVar26;
        auVar3[2] = cVar28;
        auVar3[3] = cVar29;
        auVar3[4] = cVar30;
        auVar3[5] = cVar31;
        auVar3[6] = cVar32;
        auVar3[7] = cVar33;
        auVar3[8] = cVar34;
        auVar3[9] = cVar35;
        auVar3[10] = bVar36;
        bVar9 = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar36,CONCAT18(cVar35,CONCAT17(cVar34,CONCAT16(
                                                  cVar33,CONCAT15(cVar32,CONCAT14(cVar31,CONCAT13(
                                                  cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar36,CONCAT17(cVar35,CONCAT16(cVar34,CONCAT15(
                                                  cVar33,CONCAT14(cVar32,CONCAT13(cVar31,CONCAT12(
                                                  cVar30,CONCAT11(cVar29,cVar28)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar36 >> 7) << 0xf) == 0xffff;
      }
      if (!bVar9) break;
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
      ::operator++(&local_3e0);
    }
    dVar19 = __gnu_cxx::operator-
                       ((__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                         *)in_stack_fffffffffffffaa0._M_cur,
                        (__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    if (dVar19 == 1) {
      __p = __gnu_cxx::
            __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
            ::operator*(&local_3d8);
      this_00 = __gnu_cxx::
                __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                ::operator*(local_3d0);
      std::pair<unsigned___int128,_graphStrandPos>::operator=(this_00,__p);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
      ::operator++(local_3d0);
    }
    local_3d8._M_current = local_3e0._M_current;
  }
  local_3f8 = (pair<unsigned___int128,_graphStrandPos> *)
              std::
              vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
              ::begin((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  __gnu_cxx::operator-
            ((__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
              *)in_stack_fffffffffffffaa0._M_cur,
             (__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::resize((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            *)in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                0x466ea8);
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40));
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::reserve
            ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             in_stack_fffffffffffffaa0._M_cur,
             CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)(local_10 + 0x40));
  local_450 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x466efc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffac0,
             (size_type)in_stack_fffffffffffffab8,(value_type_conflict1 *)in_stack_fffffffffffffab0,
             in_stack_fffffffffffffaa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffab0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffaa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffab0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x466f52);
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::size(&local_30);
  std::
  unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
  ::reserve((unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
             *)in_stack_fffffffffffffaa0._M_cur,
            CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  local_460 = &local_30;
  local_468._M_current =
       (pair<unsigned___int128,_graphStrandPos> *)
       std::
       vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
       ::begin((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  local_470 = (pair<unsigned___int128,_graphStrandPos> *)
              std::
              vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
              ::end((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  while (bVar9 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                             *)in_stack_fffffffffffffaa0._M_cur,
                            (__normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98)), bVar9
        ) {
    local_478 = __gnu_cxx::
                __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
                ::operator*(&local_468);
    graphStrandPos::graphStrandPos(&local_488,(local_478->second).node,(local_478->second).pos);
    pmVar20 = std::
              unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
              ::operator[]((unordered_map<unsigned___int128,_graphStrandPos,_int128_hash,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>_>
                            *)in_stack_fffffffffffffaa0._M_cur,
                           (key_type *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98)
                          );
    pmVar20->pos = local_488.pos;
    pmVar20->node = local_488.node;
    in_stack_fffffffffffffab0 =
         (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
         (in_RDI + 0x40);
    iVar11 = std::abs((int)(local_478->second).node);
    pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffab0,CONCAT44(extraout_var,iVar11));
    *pvVar16 = *pvVar16 + 1;
    iVar11 = std::abs((int)(local_478->second).node);
    pVar37 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
             insert(in_stack_fffffffffffffab0,(value_type *)CONCAT44(extraout_var_00,iVar11));
    in_stack_fffffffffffffaa0._M_cur =
         (__node_type *)pVar37.first.super__Node_iterator_base<long,_false>._M_cur;
    in_stack_fffffffffffffa9f = pVar37.second;
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
    ::operator++(&local_468);
  }
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x467128);
  kmerPosFactory128::~kmerPosFactory128((kmerPosFactory128 *)0x467135);
  FastaRecord::~FastaRecord((FastaRecord *)in_stack_fffffffffffffaa0._M_cur);
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::~vector((vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
             *)in_stack_fffffffffffffab0);
  return;
}

Assistant:

Unique63merIndex::Unique63merIndex(const SequenceDistanceGraph &sg, const uint8_t _k) : k(_k){
    kmer_to_graphposition.clear();
    std::vector<pair> kidxv;
    uint64_t total_k { 0 };
    total_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    for (sgNodeID_t node = 0; node < sg.nodes.size(); node++) {
        auto sgnode = sg.nodes[node];
        if (sgnode.sequence.size() >= k) {
            auto n = sgnode.sequence.size() + 1 - k;
            total_k += n;
            total_kmers_per_node[node] = n;
        }
    }
    kidxv.reserve(total_k);
    FastaRecord r;
    kmerPosFactory128 kcf({k});
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        if (sg.nodes[n].sequence.size() >= k) {
            r.id = n;
            r.seq = sg.nodes[n].sequence;
            kcf.setFileRecord(r);
            kcf.next_element(kidxv);
        }
    }

    sdglib::sort(kidxv.begin(),kidxv.end(),[](const pair & a, const pair & b){return a.first<b.first;});

    auto wi=kidxv.begin();
    auto ri=kidxv.begin();
    auto nri=kidxv.begin();
    while (ri<kidxv.end()){
        while (nri!=kidxv.end() and nri->first==ri->first) ++nri;
        if (nri-ri==1) {
            *wi=*ri;
            ++wi;
        }
        ri=nri;
    }
    kidxv.resize(wi - kidxv.begin());

    std::unordered_set<sgNodeID_t > seen_contigs;
    seen_contigs.reserve(sg.nodes.size());
    unique_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    kmer_to_graphposition.reserve(kidxv.size());
    for (auto &kidx :kidxv) {
        kmer_to_graphposition[kidx.first] = { kidx.second.node, kidx.second.pos };
        unique_kmers_per_node[std::abs(kidx.second.node)] += 1;
        seen_contigs.insert(std::abs(kidx.second.node));
    }
}